

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall EventLoop::wakeup(EventLoop *this)

{
  char *pcVar1;
  ssize_t v;
  LogStream *pLVar2;
  char **ppcVar3;
  uint64_t one;
  Logger local_fe0;
  
  one = 1;
  v = writen(this->wakeupFd_,&one,8);
  if (v != 8) {
    Logger::Logger(&local_fe0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/EventLoop.cpp"
                   ,0x39);
    if (8 < ((int)&local_fe0 + 0xfa8) - (int)local_fe0.impl_.stream_.buffer_.cur_) {
      builtin_strncpy(local_fe0.impl_.stream_.buffer_.cur_," EventLo",8);
      local_fe0.impl_.stream_.buffer_.cur_ = local_fe0.impl_.stream_.buffer_.cur_ + 8;
    }
    pLVar2 = LogStream::operator<<((LogStream *)&local_fe0,v);
    ppcVar3 = &(pLVar2->buffer_).cur_;
    pcVar1 = (pLVar2->buffer_).cur_;
    if (8 < (int)ppcVar3 - (int)pcVar1) {
      builtin_strncpy(pcVar1," bytes i",8);
      *ppcVar3 = *ppcVar3 + 8;
    }
    Logger::~Logger(&local_fe0);
  }
  return;
}

Assistant:

void EventLoop::wakeup(){
    uint64_t one = 1;
    ssize_t n = writen(wakeupFd_, (char *)(&one), sizeof one);
    if(n!=sizeof one){
        LOG<<" EventLoop::wakeup() writes "<<n<<" bytes instead of 8";
    }
}